

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result_reporter.hpp
# Opt level: O2

void __thiscall
iutest::detail::NewTestPartResultCheckHelper::
Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
::~Counter(Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
           *this)

{
  ReporterHolder::~ReporterHolder(&this->m_holder);
  operator_delete(this,0x20);
  return;
}

Assistant:

class Counter IUTEST_CXX_FINAL : public REPORTER
    {
        typedef REPORTER _Mybase;
    public:
        Counter() : m_count(0)
        {
            m_holder.Attach(this);
        }
        virtual void ReportTestPartResult(const TestPartResult& result) IUTEST_CXX_OVERRIDE
        {
            if( m_cond(result) )
            {
                ++m_count;
            }
            _Mybase::ReportTestPartResult(result);
        }
    public:
        int count() const IUTEST_CXX_NOEXCEPT_SPEC { return m_count; }
    private:
        ReporterHolder m_holder;
        COND m_cond;
        int m_count;

        IUTEST_PP_DISALLOW_COPY_AND_ASSIGN(Counter);
    }